

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnCallExpr
          (BinaryReaderInterp *this,Index func_index)

{
  Index IVar1;
  bool bVar2;
  Index IVar3;
  Location local_88;
  Var local_68;
  Enum local_20;
  Index local_1c;
  BinaryReaderInterp *pBStack_18;
  Index func_index_local;
  BinaryReaderInterp *this_local;
  
  local_1c = func_index;
  pBStack_18 = this;
  Location::Location(&local_88);
  Var::Var(&local_68,func_index,&local_88);
  local_20 = (Enum)SharedValidator::OnCall
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_68);
  bVar2 = Failed((Result)local_20);
  Var::~Var(&local_68);
  IVar1 = local_1c;
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    IVar3 = num_func_imports(this);
    if (IVar1 < IVar3) {
      Istream::Emit(this->istream_,InterpCallImport,local_1c);
    }
    else {
      Istream::Emit(this->istream_,Call,local_1c);
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnCallExpr(Index func_index) {
  CHECK_RESULT(validator_.OnCall(loc, Var(func_index)));

  if (func_index >= num_func_imports()) {
    istream_.Emit(Opcode::Call, func_index);
  } else {
    istream_.Emit(Opcode::InterpCallImport, func_index);
  }

  return Result::Ok;
}